

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder.cc
# Opt level: O1

EncodedInfo * __thiscall
webrtc::AudioEncoder::Encode
          (EncodedInfo *__return_storage_ptr__,AudioEncoder *this,uint32_t rtp_timestamp,
          ArrayView<const_short> audio,Buffer *encoded)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  size_t sVar4;
  string *psVar5;
  short *psVar6;
  ulong uVar7;
  TraceEndOnScopeClose trace_event_unique_profileScope32;
  ulong local_1d8;
  ArrayView<const_short> local_1d0;
  TraceEndOnScopeClose local_1c0;
  FatalMessage local_1a8;
  
  uVar7 = audio.size_;
  psVar6 = audio.data_;
  if (Encode::trace_event_unique_catstatic32 == (uchar *)0x0) {
    Encode::trace_event_unique_catstatic32 = EventTracer::GetCategoryEnabled("webrtc");
  }
  local_1c0.p_data_ = (Data *)0x0;
  if (*Encode::trace_event_unique_catstatic32 != '\0') {
    EventTracer::AddTraceEvent
              ('B',Encode::trace_event_unique_catstatic32,"AudioEncoder::Encode",0,0,(char **)0x0,
               (uchar *)0x0,(unsigned_long_long *)0x0,'\0');
    local_1c0.p_data_ = &local_1c0.data_;
    local_1c0.data_.category_enabled = Encode::trace_event_unique_catstatic32;
    local_1c0.data_.name = "AudioEncoder::Encode";
  }
  local_1a8._0_8_ = uVar7;
  iVar1 = (*this->_vptr_AudioEncoder[3])(this);
  iVar2 = (*this->_vptr_AudioEncoder[2])(this);
  local_1d8 = (ulong)(CONCAT44(extraout_var,iVar1) * (long)iVar2) / 100;
  if (local_1a8._0_8_ == local_1d8) {
    psVar5 = (string *)0x0;
  }
  else {
    psVar5 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,&local_1d8,
                        "audio.size() == static_cast<size_t>(NumChannels() * SampleRateHz() / 100)")
    ;
  }
  if (psVar5 == (string *)0x0) {
    sVar3 = rtc::Buffer::size(encoded);
    if (uVar7 == 0) {
      psVar6 = (short *)0x0;
    }
    local_1d0.data_ = psVar6;
    local_1d0.size_ = uVar7;
    rtc::ArrayView<const_short>::CheckInvariant(&local_1d0);
    (*this->_vptr_AudioEncoder[0xf])
              (__return_storage_ptr__,this,(ulong)rtp_timestamp,local_1d0.data_,local_1d0.size_,
               encoded);
    sVar4 = rtc::Buffer::size(encoded);
    local_1a8._0_8_ = sVar4 - sVar3;
    if (local_1a8._0_8_ == (__return_storage_ptr__->super_EncodedInfoLeaf).encoded_bytes) {
      psVar5 = (string *)0x0;
    }
    else {
      psVar5 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_1a8,(unsigned_long *)__return_storage_ptr__,
                          "encoded->size() - old_size == info.encoded_bytes");
    }
    if (psVar5 == (string *)0x0) {
      trace_event_internal::TraceEndOnScopeClose::~TraceEndOnScopeClose(&local_1c0);
      return __return_storage_ptr__;
    }
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/audio_encoder.cc"
               ,0x26,psVar5);
  }
  else {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/audio_encoder.cc"
               ,0x22,psVar5);
  }
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

AudioEncoder::EncodedInfo AudioEncoder::Encode(
    uint32_t rtp_timestamp,
    rtc::ArrayView<const int16_t> audio,
    rtc::Buffer* encoded) {
  TRACE_EVENT0("webrtc", "AudioEncoder::Encode");
  RTC_CHECK_EQ(audio.size(),
               static_cast<size_t>(NumChannels() * SampleRateHz() / 100));

  const size_t old_size = encoded->size();
  EncodedInfo info = EncodeImpl(rtp_timestamp, audio, encoded);
  RTC_CHECK_EQ(encoded->size() - old_size, info.encoded_bytes);
  return info;
}